

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void hmac_drbg_generate(cf_hmac_drbg *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  uint32_t uVar1;
  uint8_t *local_320;
  size_t take;
  cf_hmac_ctx local;
  uint8_t *bout;
  size_t nout_local;
  void *out_local;
  size_t naddnl_local;
  void *addnl_local;
  cf_hmac_drbg *ctx_local;
  
  uVar1 = cf_hmac_drbg_needs_reseed(ctx);
  if (uVar1 == 0) {
    local.outer._352_8_ = out;
    bout = (uint8_t *)nout;
    if (naddnl != 0) {
      hmac_drbg_update(ctx,addnl,naddnl,(void *)0x0,0,(void *)0x0,0);
    }
    for (; bout != (uint8_t *)0x0; bout = bout + -(long)local_320) {
      memcpy(&take,&ctx->hmac,0x2d8);
      cf_hmac_update((cf_hmac_ctx *)&take,ctx,((ctx->hmac).hash)->hashsz);
      cf_hmac_finish((cf_hmac_ctx *)&take,ctx->V);
      if ((uint8_t *)((ctx->hmac).hash)->hashsz < bout) {
        local_320 = (uint8_t *)((ctx->hmac).hash)->hashsz;
      }
      else {
        local_320 = bout;
      }
      memcpy((void *)local.outer._352_8_,ctx,(size_t)local_320);
      local.outer._352_8_ = local_320 + local.outer._352_8_;
    }
    hmac_drbg_update(ctx,addnl,naddnl,(void *)0x0,0,(void *)0x0,0);
    ctx->reseed_counter = ctx->reseed_counter + 1;
    return;
  }
  abort();
}

Assistant:

static void hmac_drbg_generate(cf_hmac_drbg *ctx,
                               const void *addnl, size_t naddnl,
                               void *out, size_t nout)
{
  /* 1. If reseed_counter > reseed_interval, then return an indication
   * that a reseed is required */
  assert(!cf_hmac_drbg_needs_reseed(ctx));

  /* 2. If additional_input != null, then
   *    (Key, V) = HMAC_DRBG_Update(additional_input, Key, V)
   */
  if (naddnl)
    hmac_drbg_update(ctx, addnl, naddnl, NULL, 0, NULL, 0);

  /* 3. temp = Null
   * 4. While (len(temp) < requested_number_of_bits) do:
   *   4.1. V = HMAC(Key, V)
   *   4.2. temp = temp || V
   * 5. returned_bits = leftmost(temp, requested_number_of_bits)
   *
   * We write the contents of temp directly into the caller's
   * out buffer.
   */
  uint8_t *bout = out;
  cf_hmac_ctx local;

  while (nout)
  {
    local = ctx->hmac;
    cf_hmac_update(&local, ctx->V, ctx->hmac.hash->hashsz);
    cf_hmac_finish(&local, ctx->V);

    size_t take = MIN(ctx->hmac.hash->hashsz, nout);
    memcpy(bout, ctx->V, take);
    bout += take;
    nout -= take;
  }

  /* 6. (Key, V) = HMAC_DRBG_Update(additional_input, Key, V) */
  hmac_drbg_update(ctx, addnl, naddnl, NULL, 0, NULL, 0);

  /* 7. reseed_counter = reseed_counter + 1 */
  ctx->reseed_counter++;
}